

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_lookup.c
# Opt level: O0

int64_t group_lookup(void *d,char *name,int64_t g)

{
  int iVar1;
  undefined8 in_RDX;
  char *in_RSI;
  longlong in_RDI;
  void *unaff_retaddr;
  int *mp;
  char *in_stack_ffffffffffffffd0;
  int64_t local_8;
  
  assertion_equal_int(in_RSI,(wchar_t)((ulong)in_RDX >> 0x20),in_RDI,in_stack_ffffffffffffffd0,0,
                      (char *)0x1cf574,unaff_retaddr);
  iVar1 = strcmp(in_RSI,"FOOGROUP");
  if (iVar1 == 0) {
    local_8 = 0x49;
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

static int64_t
group_lookup(void *d, const char *name, int64_t g)
{
	int *mp = d;

	(void)g; /* UNUSED */

	assertEqualInt(*mp, 0x13579);
	if (strcmp(name, "FOOGROUP"))
		return (1);
	return (73);
}